

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  ImGuiTabItem *pIVar9;
  ImDrawList *this;
  int iVar10;
  int tab_n;
  uint i;
  undefined8 uVar11;
  char *pcVar12;
  ImVec2 local_148;
  ImVec2 local_140;
  char buf [256];
  undefined1 local_38 [8];
  
  iVar1 = tab_bar->PrevFrameVisible;
  iVar5 = GImGui->FrameCount + -2;
  pcVar8 = " *Inactive*";
  if (iVar5 <= iVar1) {
    pcVar8 = "";
  }
  iVar6 = ImFormatString(buf,0x100,"%s 0x%08X (%d tabs)%s",label,(ulong)tab_bar->ID,
                         (ulong)(uint)(tab_bar->Tabs).Size,pcVar8);
  iVar7 = ImFormatString(buf + iVar6,0x100 - (long)iVar6,"  { ");
  pcVar8 = buf + iVar6 + iVar7;
  iVar6 = 0;
  while( true ) {
    iVar7 = (tab_bar->Tabs).Size;
    iVar10 = 3;
    if (iVar7 < 3) {
      iVar10 = iVar7;
    }
    if (iVar10 <= iVar6) break;
    pIVar9 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar6);
    pcVar12 = ", ";
    if (iVar6 == 0) {
      pcVar12 = "";
    }
    if ((pIVar9->Window != (ImGuiWindow *)0x0) || (pIVar9->NameOffset != -1)) {
      ImGuiTabBar::GetTabName(tab_bar,pIVar9);
    }
    iVar7 = ImFormatString(pcVar8,(size_t)(local_38 + -(long)pcVar8),"%s\'%s\'",pcVar12);
    pcVar8 = pcVar8 + iVar7;
    iVar6 = iVar6 + 1;
  }
  pcVar12 = " } ";
  if (3 < iVar7) {
    pcVar12 = " ... }";
  }
  ImFormatString(pcVar8,(size_t)(local_38 + -(long)pcVar8),pcVar12);
  if (iVar1 < iVar5) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
  }
  bVar3 = TreeNode(label,"%s",buf);
  if (iVar1 < iVar5) {
    PopStyleColor(1);
  }
  else {
    bVar4 = IsItemHovered(0);
    if (bVar4) {
      this = GetForegroundDrawList();
      ImDrawList::AddRect(this,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0,1.0)
      ;
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMinX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMaxX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
    }
  }
  if (bVar3) {
    for (i = 0; (int)i < (tab_bar->Tabs).Size; i = i + 1) {
      pIVar9 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,i);
      PushID(pIVar9);
      bVar3 = SmallButton("<");
      if (bVar3) {
        TabBarQueueReorder(tab_bar,pIVar9,-1);
      }
      SameLine(0.0,2.0);
      bVar3 = SmallButton(">");
      if (bVar3) {
        TabBarQueueReorder(tab_bar,pIVar9,1);
      }
      SameLine(0.0,-1.0);
      uVar2 = pIVar9->ID;
      uVar11 = 0x2a;
      if (uVar2 != tab_bar->SelectedTabId) {
        uVar11 = 0x20;
      }
      if ((pIVar9->Window != (ImGuiWindow *)0x0) || (pcVar8 = "???", pIVar9->NameOffset != -1)) {
        pcVar8 = ImGuiTabBar::GetTabName(tab_bar,pIVar9);
      }
      Text("%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",(double)pIVar9->Offset,
           (double)pIVar9->Width,(double)pIVar9->ContentWidth,(ulong)i,uVar11,(ulong)uVar2,pcVar8);
      PopID();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    p += ImFormatString(p, buf_end - p, "  { ");
    for (int tab_n = 0; tab_n < ImMin(tab_bar->Tabs.Size, 3); tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        p += ImFormatString(p, buf_end - p, "%s'%s'",
            tab_n > 0 ? ", " : "", (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???");
    }
    p += ImFormatString(p, buf_end - p, (tab_bar->Tabs.Size > 3) ? " ... }" : " } ");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(label, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}